

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O1

void WebRtc_rdft(size_t n,int isgn,float *a,size_t *ip,float *w)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  sVar5 = *ip;
  if (sVar5 * 4 < n) {
    sVar5 = n >> 2;
    *ip = sVar5;
    ip[1] = 1;
    if (0xb < n) {
      uVar3 = n >> 3;
      fVar12 = 0.7853982 / (float)uVar3;
      w[0] = 1.0;
      w[1] = 0.0;
      fVar10 = cosf((float)uVar3 * fVar12);
      w[uVar3] = fVar10;
      w[uVar3 + 1] = fVar10;
      if (0x17 < n) {
        pfVar8 = w + (sVar5 - 1);
        uVar6 = 2;
        do {
          fVar10 = (float)(long)uVar6 * fVar12;
          fVar11 = cosf(fVar10);
          fVar10 = sinf(fVar10);
          w[uVar6] = fVar11;
          w[uVar6 + 1] = fVar10;
          pfVar8[-1] = fVar10;
          *pfVar8 = fVar11;
          uVar6 = uVar6 + 2;
          pfVar8 = pfVar8 + -2;
        } while (uVar6 < uVar3);
        bitrv2(sVar5,ip + 2,w);
      }
    }
  }
  sVar4 = ip[1];
  if (sVar4 * 4 < n) {
    sVar4 = n >> 2;
    ip[1] = sVar4;
    if (7 < n) {
      uVar3 = n >> 3;
      pfVar8 = w + sVar5;
      fVar12 = 0.7853982 / (float)uVar3;
      fVar10 = cosf((float)uVar3 * fVar12);
      *pfVar8 = fVar10;
      pfVar8[uVar3] = fVar10 * 0.5;
      if (0xf < n) {
        pfVar9 = w + sVar5 + sVar4;
        uVar6 = 1;
        do {
          pfVar9 = pfVar9 + -1;
          fVar10 = (float)(long)uVar6 * fVar12;
          fVar11 = cosf(fVar10);
          pfVar8[uVar6] = fVar11 * 0.5;
          fVar10 = sinf(fVar10);
          *pfVar9 = fVar10 * 0.5;
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
    }
  }
  if (isgn < 0) {
    fVar10 = (*a - a[1]) * 0.5;
    a[1] = fVar10;
    *a = *a - fVar10;
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
        return;
      }
    }
    else {
      a[1] = -fVar10;
      uVar3 = n >> 1;
      if (n != 5) {
        lVar2 = n - 1;
        uVar6 = 2;
        lVar7 = 0;
        do {
          lVar7 = lVar7 + (sVar4 * 2) / uVar3;
          fVar10 = a[uVar6] - a[lVar2 + -1];
          fVar12 = a[lVar2] + a[uVar6 + 1];
          fVar11 = (0.5 - w[sVar5 + (sVar4 - lVar7)]) * fVar10 + w[sVar5 + lVar7] * fVar12;
          fVar10 = fVar12 * (0.5 - w[sVar5 + (sVar4 - lVar7)]) - fVar10 * w[sVar5 + lVar7];
          a[uVar6] = a[uVar6] - fVar11;
          a[uVar6 + 1] = fVar10 - a[uVar6 + 1];
          a[lVar2 + -1] = fVar11 + a[lVar2 + -1];
          a[lVar2] = fVar10 - a[lVar2];
          uVar6 = uVar6 + 2;
          lVar2 = lVar2 + -2;
        } while (uVar6 < uVar3);
      }
      a[uVar3 + 1] = -a[uVar3 + 1];
      bitrv2(n,ip + 2,a);
      uVar3 = 2;
      if (8 < n) {
        cft1st(n,a,w);
        uVar3 = 8;
        if (0x20 < n) {
          uVar6 = 0x20;
          sVar5 = 8;
          do {
            uVar3 = uVar6;
            cftmdl(n,sVar5,a,w);
            uVar6 = uVar3 * 4;
            sVar5 = uVar3;
          } while (uVar3 * 4 < n);
        }
      }
      if (uVar3 * 4 - n == 0) {
        if (uVar3 != 0) {
          uVar6 = 0;
          do {
            lVar2 = uVar6 + uVar3;
            lVar7 = lVar2 + uVar3;
            lVar1 = lVar7 + uVar3;
            fVar14 = a[uVar6] + a[lVar2];
            fVar15 = -a[uVar6 + 1] - a[lVar2 + 1];
            fVar10 = a[uVar6] - a[lVar2];
            fVar12 = a[lVar2 + 1] - a[uVar6 + 1];
            fVar16 = a[lVar7] + a[lVar1];
            fVar17 = a[lVar7 + 1] + a[lVar1 + 1];
            fVar11 = a[lVar7] - a[lVar1];
            fVar13 = a[lVar7 + 1] - a[lVar1 + 1];
            a[uVar6] = fVar14 + fVar16;
            a[uVar6 + 1] = fVar15 - fVar17;
            a[lVar7] = fVar14 - fVar16;
            a[lVar7 + 1] = fVar17 + fVar15;
            a[lVar2] = fVar10 - fVar13;
            a[lVar2 + 1] = fVar12 - fVar11;
            a[lVar1] = fVar13 + fVar10;
            a[lVar1 + 1] = fVar11 + fVar12;
            uVar6 = uVar6 + 2;
          } while (uVar6 < uVar3);
        }
      }
      else if (uVar3 != 0) {
        uVar6 = 0;
        do {
          fVar10 = a[uVar6];
          fVar12 = a[uVar6 + 1];
          fVar11 = a[uVar3 + uVar6];
          fVar13 = a[uVar3 + uVar6 + 1];
          a[uVar6] = fVar10 + fVar11;
          a[uVar6 + 1] = -fVar12 - a[uVar3 + uVar6 + 1];
          a[uVar3 + uVar6] = fVar10 - fVar11;
          a[uVar3 + uVar6 + 1] = fVar13 - fVar12;
          uVar6 = uVar6 + 2;
        } while (uVar6 < uVar3);
      }
    }
  }
  else {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(n,ip + 2,a);
      cftfsub(n,a,w);
      if (n != 5) {
        lVar7 = n - 1;
        uVar3 = 2;
        lVar2 = 0;
        do {
          lVar2 = lVar2 + (sVar4 * 2) / (n >> 1);
          fVar12 = a[uVar3] - a[lVar7 + -1];
          fVar11 = a[lVar7] + a[uVar3 + 1];
          fVar10 = (0.5 - w[sVar5 + (sVar4 - lVar2)]) * fVar12 - fVar11 * w[sVar5 + lVar2];
          fVar12 = fVar11 * (0.5 - w[sVar5 + (sVar4 - lVar2)]) + fVar12 * w[sVar5 + lVar2];
          a[uVar3] = a[uVar3] - fVar10;
          a[uVar3 + 1] = a[uVar3 + 1] - fVar12;
          a[lVar7 + -1] = fVar10 + a[lVar7 + -1];
          a[lVar7] = a[lVar7] - fVar12;
          uVar3 = uVar3 + 2;
          lVar7 = lVar7 + -2;
        } while (uVar3 < n >> 1);
      }
    }
    fVar10 = *a;
    *a = fVar10 + a[1];
    a[1] = fVar10 - a[1];
  }
  return;
}

Assistant:

void WebRtc_rdft(size_t n, int isgn, float *a, size_t *ip, float *w) {
    size_t nw, nc;
    float xi;

    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 2)) {
        nc = n >> 2;
        makect(nc, ip, w + nw);
    }
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xi = a[0] - a[1];
        a[0] += a[1];
        a[1] = xi;
    } else {
        a[1] = 0.5f * (a[0] - a[1]);
        a[0] -= a[1];
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
}